

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::StrengthReductionPass::Process(StrengthReductionPass *this)

{
  bool bVar1;
  
  memset(&(this->super_Pass).field_0x34,0,0x8c);
  FindIntTypesAndConstants(this);
  bVar1 = ScanFunctions(this);
  return bVar1 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status StrengthReductionPass::Process() {
  // Initialize the member variables on a per module basis.
  bool modified = false;
  int32_type_id_ = 0;
  uint32_type_id_ = 0;
  std::memset(constant_ids_, 0, sizeof(constant_ids_));

  FindIntTypesAndConstants();
  modified = ScanFunctions();
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}